

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O2

void print_labeled_statement_tree(FILE *out,AST_Labeled_Statement *lab)

{
  if (lab->type != ST_LABEL) {
    print_ast_enum(out,lab->type);
  }
  if (lab->label != (token *)0x0) {
    print_token(out,lab->label);
  }
  fwrite(":\n",2,1,(FILE *)out);
  print_ast(out,lab->statement);
  return;
}

Assistant:

void print_labeled_statement_tree(FILE *out,struct AST_Labeled_Statement *lab)
{
	if(lab->type!=ST_LABEL)
		print_ast_enum(out,lab->type);
	if(lab->label!=NULL)
		print_token(out,lab->label);
	fprintf(out,":\n");
	print_ast(out,lab->statement);
}